

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# legacy.c
# Opt level: O0

void upgradeProperty(objc_property *n,objc_property_gsv1 *o)

{
  BOOL BVar1;
  char *pcVar2;
  size_t sVar3;
  SEL poVar4;
  char *pcVar5;
  char *__dest;
  size_t local_a8;
  uchar *puStack_90;
  BOOL needsComma;
  uchar *insert;
  uchar *encoding;
  size_t getterLength;
  size_t setterLength;
  size_t i;
  char flags [20];
  size_t encodingSize;
  size_t nameSize;
  char *name;
  char *type_end;
  char *type_start;
  ptrdiff_t typeSize;
  char *typeEncoding;
  objc_property_gsv1 *o_local;
  objc_property *n_local;
  
  if (*o->name == '\0') {
    n->name = o->name + (int)o->name[1];
    n->attributes = o->name + 2;
    if (*n->attributes != 'T') {
      __assert_fail("n->attributes[0] == \'T\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/legacy.c",
                    0xb5,"void upgradeProperty(struct objc_property *, struct objc_property_gsv1 *)"
                   );
    }
    pcVar2 = n->attributes + 1;
    name = strchr(pcVar2,0x2c);
    if (name == (char *)0x0) {
      sVar3 = strlen(pcVar2);
      name = pcVar2 + sVar3;
    }
    type_start = name + -(long)pcVar2;
    typeSize = (ptrdiff_t)malloc((size_t)(type_start + 1));
    memcpy((void *)typeSize,pcVar2,(size_t)type_start);
    *(char *)(typeSize + (long)type_start) = '\0';
  }
  else {
    type_start = (char *)lengthOfTypeEncoding(o->getter_types);
    typeSize = (ptrdiff_t)malloc((size_t)(type_start + 1));
    memcpy((void *)typeSize,o->getter_types,(size_t)type_start);
    *(char *)(typeSize + (long)type_start) = '\0';
  }
  n->type = (char *)typeSize;
  if (o->getter_name != (char *)0x0) {
    poVar4 = sel_registerTypedName_np(o->getter_name,o->getter_types);
    n->getter = poVar4;
  }
  if (o->setter_name != (char *)0x0) {
    poVar4 = sel_registerTypedName_np(o->setter_name,o->setter_types);
    n->setter = poVar4;
  }
  if (*o->name != '\0') {
    n->name = o->name;
    pcVar2 = o->name;
    if (pcVar2 == (char *)0x0) {
      local_a8 = 0;
    }
    else {
      local_a8 = strlen(pcVar2);
    }
    register0x00000000 = (uchar *)(type_start + local_a8 + 6);
    setterLength = 0;
    BVar1 = checkAttribute(o->attributes,1);
    if (BVar1 != '\0') {
      i._0_1_ = 0x2c;
      setterLength = 2;
      i._1_1_ = 0x52;
    }
    BVar1 = checkAttribute(o->attributes,0x10);
    if (BVar1 != '\0') {
      flags[setterLength - 8] = ',';
      flags[setterLength - 7] = '&';
      setterLength = setterLength + 2;
    }
    BVar1 = checkAttribute(o->attributes,0x20);
    if (BVar1 != '\0') {
      flags[setterLength - 8] = ',';
      flags[setterLength - 7] = 'C';
      setterLength = setterLength + 2;
    }
    BVar1 = checkAttribute(o->attributes2,8);
    if (BVar1 != '\0') {
      flags[setterLength - 8] = ',';
      flags[setterLength - 7] = 'W';
      setterLength = setterLength + 2;
    }
    BVar1 = checkAttribute(o->attributes2,2);
    if (BVar1 != '\0') {
      flags[setterLength - 8] = ',';
      flags[setterLength - 7] = 'D';
      setterLength = setterLength + 2;
    }
    if ((o->attributes & 0x40U) == 0x40) {
      flags[setterLength - 8] = ',';
      flags[setterLength - 7] = 'N';
      setterLength = setterLength + 2;
    }
    register0x00000000 = (uchar *)((char *)stack0xffffffffffffffb0 + setterLength);
    flags[setterLength - 8] = '\0';
    getterLength = 0;
    encoding = (uchar *)0x0;
    if ((o->attributes & 2U) == 2) {
      encoding = (uchar *)strlen(o->getter_name);
      register0x00000000 = encoding + 2 + (long)stack0xffffffffffffffb0;
    }
    if (((int)o->attributes & 0x80U) == 0x80) {
      getterLength = strlen(o->setter_name);
      register0x00000000 = stack0xffffffffffffffb0 + getterLength + 2;
    }
    pcVar5 = (char *)malloc((size_t)stack0xffffffffffffffb0);
    *pcVar5 = '\0';
    pcVar5[1] = '\0';
    __dest = pcVar5 + 3;
    pcVar5[2] = 'T';
    memcpy(__dest,(void *)typeSize,(size_t)type_start);
    memcpy(type_start + (long)__dest,&i,setterLength);
    puStack_90 = (uchar *)(type_start + (long)__dest + setterLength);
    if ((o->attributes & 2U) == 2) {
      *puStack_90 = ',';
      puStack_90[1] = 'G';
      memcpy(puStack_90 + 2,o->getter_name,(size_t)encoding);
      puStack_90 = encoding + (long)(puStack_90 + 2);
    }
    if (((int)o->attributes & 0x80U) == 0x80) {
      *puStack_90 = ',';
      puStack_90[1] = 'S';
      memcpy(puStack_90 + 2,o->setter_name,getterLength);
      puStack_90 = puStack_90 + 2 + getterLength;
    }
    *puStack_90 = ',';
    puStack_90[1] = 'V';
    memcpy(puStack_90 + 2,pcVar2,local_a8);
    (puStack_90 + 2)[local_a8] = '\0';
    n->attributes = pcVar5;
  }
  return;
}

Assistant:

static void upgradeProperty(struct objc_property *n, struct objc_property_gsv1 *o)
{
	char *typeEncoding;
	ptrdiff_t typeSize;
	if (o->name[0] == '\0')
	{
		n->name = o->name + o->name[1];
		n->attributes = o->name + 2;
		// If we have an attribute string, then it will contain a more accurate
		// version of the types than we'll find in the getter (qualifiers such
		// as _Atomic and volatile may be dropped)
		assert(n->attributes[0] == 'T');
		const char *type_start = &n->attributes[1];
		const char *type_end = strchr(type_start, ',');
		if (type_end == NULL)
		{
			type_end = type_start + strlen(type_start);
		}
		typeSize = type_end - type_start;
		typeEncoding = malloc(typeSize  + 1);
		memcpy(typeEncoding, type_start, typeSize);
		typeEncoding[typeSize] = 0;
	}
	else
	{
		typeSize = (ptrdiff_t)lengthOfTypeEncoding(o->getter_types);
		typeEncoding = malloc(typeSize + 1);
		memcpy(typeEncoding, o->getter_types, typeSize);
		typeEncoding[typeSize] = 0;
	}
	n->type = typeEncoding;

	if (o->getter_name)
	{
		n->getter = sel_registerTypedName_np(o->getter_name, o->getter_types);
	}
	if (o->setter_name)
	{
		n->setter = sel_registerTypedName_np(o->setter_name, o->setter_types);
	}

	if (o->name[0] == '\0')
	{
		return;
	}

	n->name = o->name;

	const char *name = o->name;
	size_t nameSize = (NULL == name) ? 0 : strlen(name);
	// Encoding is T{type},V{name}, so 4 bytes for the "T,V" that we always
	// need.  We also need two bytes for the leading null and the length.
	size_t encodingSize = typeSize + nameSize + 6;
	char flags[20];
	size_t i = 0;
	// Flags that are a comma then a character
	if (checkAttribute(o->attributes, OBJC_PR_readonly))
	{
		flags[i++] = ',';
		flags[i++] = 'R';
	}
	if (checkAttribute(o->attributes, OBJC_PR_retain))
	{
		flags[i++] = ',';
		flags[i++] = '&';
	}
	if (checkAttribute(o->attributes, OBJC_PR_copy))
	{
		flags[i++] = ',';
		flags[i++] = 'C';
	}
	if (checkAttribute(o->attributes2, OBJC_PR_weak))
	{
		flags[i++] = ',';
		flags[i++] = 'W';
	}
	if (checkAttribute(o->attributes2, OBJC_PR_dynamic))
	{
		flags[i++] = ',';
		flags[i++] = 'D';
	}
	if ((o->attributes & OBJC_PR_nonatomic) == OBJC_PR_nonatomic)
	{
		flags[i++] = ',';
		flags[i++] = 'N';
	}
	encodingSize += i;
	flags[i] = '\0';
	size_t setterLength = 0;
	size_t getterLength = 0;
	if ((o->attributes & OBJC_PR_getter) == OBJC_PR_getter)
	{
		getterLength = strlen(o->getter_name);
		encodingSize += 2 + getterLength;
	}
	if ((o->attributes & OBJC_PR_setter) == OBJC_PR_setter)
	{
		setterLength = strlen(o->setter_name);
		encodingSize += 2 + setterLength;
	}
	unsigned char *encoding = malloc(encodingSize);
	// Set the leading 0 and the offset of the name
	unsigned char *insert = encoding;
	BOOL needsComma = NO;
	*(insert++) = 0;
	*(insert++) = 0;
	// Set the type encoding
	*(insert++) = 'T';
	memcpy(insert, typeEncoding, typeSize);
	insert += typeSize;
	needsComma = YES;
	// Set the flags
	memcpy(insert, flags, i);
	insert += i;
	if ((o->attributes & OBJC_PR_getter) == OBJC_PR_getter)
	{
		if (needsComma)
		{
			*(insert++) = ',';
		}
		i++;
		needsComma = YES;
		*(insert++) = 'G';
		memcpy(insert, o->getter_name, getterLength);
		insert += getterLength;
	}
	if ((o->attributes & OBJC_PR_setter) == OBJC_PR_setter)
	{
		if (needsComma)
		{
			*(insert++) = ',';
		}
		i++;
		needsComma = YES;
		*(insert++) = 'S';
		memcpy(insert, o->setter_name, setterLength);
		insert += setterLength;
	}
	if (needsComma)
	{
		*(insert++) = ',';
	}
	*(insert++) = 'V';
	memcpy(insert, name, nameSize);
	insert += nameSize;
	*(insert++) = '\0';

	n->attributes = (const char*)encoding;
}